

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall MT32Emu::Synth::setReverbCompatibilityMode(Synth *this,bool mt32CompatibleMode)

{
  BReverbModel *pBVar1;
  int iVar2;
  long lVar3;
  
  if (this->opened == true) {
    iVar2 = (*this->reverbModels[0]->_vptr_BReverbModel[8])(this->reverbModels[0],0);
    if ((bool)(char)iVar2 != mt32CompatibleMode) {
      pBVar1 = this->reverbModel;
      if ((pBVar1 != (BReverbModel *)0x0 & this->opened) == 1) {
        if (this->extensions->preallocatedReverbMemory == false) {
          (*pBVar1->_vptr_BReverbModel[4])(pBVar1);
        }
        this->reverbModel = (BReverbModel *)0x0;
      }
      lVar3 = 0x2026;
      do {
        if (*(long **)(this->controlROMData + lVar3 * 8 + -0x60) != (long *)0x0) {
          (**(code **)(**(long **)(this->controlROMData + lVar3 * 8 + -0x60) + 8))();
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x202a);
      initReverbModels(this,mt32CompatibleMode);
      setReverbEnabled(this,pBVar1 != (BReverbModel *)0x0);
      setReverbOutputGain(this,this->reverbOutputGain);
      return;
    }
  }
  return;
}

Assistant:

void Synth::setReverbCompatibilityMode(bool mt32CompatibleMode) {
	if (!opened || (isMT32ReverbCompatibilityMode() == mt32CompatibleMode)) return;
	bool oldReverbEnabled = isReverbEnabled();
	setReverbEnabled(false);
	for (int i = REVERB_MODE_ROOM; i <= REVERB_MODE_TAP_DELAY; i++) {
		delete reverbModels[i];
	}
	initReverbModels(mt32CompatibleMode);
	setReverbEnabled(oldReverbEnabled);
	setReverbOutputGain(reverbOutputGain);
}